

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ZeroCopyOutputStream::WriteCord(ZeroCopyOutputStream *this,Cord *cord)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__src;
  ulong __n;
  reference rVar4;
  int buffer_size;
  void *buffer;
  ChunkIterator __begin2;
  uint local_d4;
  void *local_d0;
  ChunkIterator local_c8;
  
  bVar1 = absl::lts_20240722::Cord::empty(cord);
  bVar2 = true;
  if (!bVar1) {
    local_d4 = 0;
    iVar3 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0);
    if ((char)iVar3 == '\0') {
LAB_00286c13:
      bVar2 = false;
    }
    else {
      absl::lts_20240722::Cord::ChunkIterator::ChunkIterator(&local_c8,cord);
      while (local_c8.bytes_remaining_ != 0) {
        rVar4 = absl::lts_20240722::Cord::ChunkIterator::operator*(&local_c8);
        while( true ) {
          __src = rVar4._M_str;
          __n = rVar4._M_len;
          if (__n <= (ulong)(long)(int)local_d4) break;
          memcpy(local_d0,__src,(long)(int)local_d4);
          rVar4._M_str = __src + (int)local_d4;
          rVar4._M_len = __n - (long)(int)local_d4;
          iVar3 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0,&local_d4);
          if ((char)iVar3 == '\0') goto LAB_00286c13;
        }
        memcpy(local_d0,__src,__n);
        local_d0 = (void *)((long)local_d0 + __n);
        local_d4 = local_d4 - (int)rVar4._M_len;
        absl::lts_20240722::Cord::ChunkIterator::operator++(&local_c8);
      }
      (*this->_vptr_ZeroCopyOutputStream[3])(this,(ulong)local_d4);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool ZeroCopyOutputStream::WriteCord(const absl::Cord& cord) {
  if (cord.empty()) return true;

  void* buffer;
  int buffer_size = 0;
  if (!Next(&buffer, &buffer_size)) return false;

  for (absl::string_view fragment : cord.Chunks()) {
    while (fragment.size() > static_cast<size_t>(buffer_size)) {
      std::memcpy(buffer, fragment.data(), buffer_size);

      fragment.remove_prefix(buffer_size);

      if (!Next(&buffer, &buffer_size)) return false;
    }
    std::memcpy(buffer, fragment.data(), fragment.size());

    // Advance the buffer.
    buffer = static_cast<char*>(buffer) + fragment.size();
    buffer_size -= static_cast<int>(fragment.size());
  }
  BackUp(buffer_size);
  return true;
}